

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark2.cpp
# Opt level: O3

void onConnect(int fd)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> callback;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 local_e8 [24];
  element_type *local_d0;
  undefined1 local_c8 [16];
  code *local_b8;
  element_type *local_b0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  code *local_a0;
  size_type *local_98;
  string msg;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  code *local_68;
  void *local_60;
  code *local_58;
  code *local_50;
  undefined1 local_48 [8];
  Ptr buff;
  Ptr sc;
  
  puts("onConnect");
  local_98 = &msg._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_98,(char)packetSize);
  hwnet::Buffer::New((Buffer *)local_48,(char *)local_98,(size_t)msg._M_dataplus._M_p);
  hwnet::TCPSocket::New
            ((TCPSocket *)
             &buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &poller_,pools.
                      super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [(ulong)(long)fd %
                       (ulong)((long)pools.
                                     super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)pools.
                                     super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3)],fd);
  local_60 = (void *)0x0;
  local_68 = onDataClient;
  local_50 = std::
             _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
             ::_M_manager;
  hwnet::TCPSocket::SetRecvCallback
            ((TCPSocket *)((long)&msg.field_2 + 8),
             (RecvCallback *)
             buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  local_b0 = (element_type *)0x0;
  local_b8 = onError;
  local_a0 = std::
             _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>
             ::_M_invoke;
  local_a8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>
       ::_M_manager;
  hwnet::TCPSocket::SetErrorCallback((TCPSocket *)local_e8,(ErrorCallback *)msg.field_2._8_8_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)local_a8._M_pi)(&local_b8,&local_b8,3);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  callback._M_pi =
       buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  peVar2 = buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &((buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->buff).
                super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = &((buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->buff).
                super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
  }
  local_60 = (void *)0x0;
  local_68 = (code *)operator_new(0x10);
  *(undefined1 (*) [8])local_68 = local_48;
  *(element_type **)(local_68 + 8) = peVar2;
  local_50 = std::
             _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/benmark2.cpp:93:23)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/benmark2.cpp:93:23)>
             ::_M_manager;
  hwnet::TCPSocket::SetFlushCallback((TCPSocket *)(local_e8 + 0x10),(FlushCallback *)callback._M_pi)
  ;
  if (local_d0 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0);
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  hwnet::TCPSocket::Start((TCPSocket *)local_c8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  hwnet::TCPSocket::Send
            ((TCPSocket *)
             buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             (Ptr *)local_48,0);
  if (sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (local_98 != &msg._M_string_length) {
    operator_delete(local_98,msg._M_string_length + 1);
  }
  return;
}

Assistant:

void onConnect(int fd) {
	printf("onConnect\n");
	std::string msg = std::string(packetSize,'a');
	auto buff = Buffer::New(msg);
	ThreadPool *t = pools[fd%pools.size()];
	auto sc = TCPSocket::New(&poller_,t,fd);
	sc->SetRecvCallback(onDataClient)->SetErrorCallback(onError);
	sc->SetFlushCallback([buff](const TCPSocket::Ptr &s){
		s->Recv(buff);
	});	
	sc->Start();
	sc->Send(buff);
}